

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall
Minisat::IntOption::fillGranularityDomain
          (IntOption *this,int granularity,vector<int,_std::allocator<int>_> *values)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong __new_size;
  uint uVar5;
  
  std::vector<int,_std::allocator<int>_>::resize(values,(long)granularity);
  piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *piVar1 = this->value;
  iVar3 = 0x200;
  if (this->value < 16000) {
    iVar3 = 0x40;
  }
  uVar5 = 1;
  if (this->value < 0x10) {
    iVar3 = 1;
  }
  if (1 < granularity) {
    piVar1[1] = this->defaultValue;
    uVar5 = 2;
  }
  do {
    iVar2 = iVar3;
    if (granularity <= (int)uVar5) break;
    if ((iVar2 != 0) && (iVar3 = this->value + iVar2, iVar3 <= (this->range).end)) {
      lVar4 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      piVar1[lVar4] = iVar3;
    }
    if (((int)uVar5 < granularity) && (iVar3 = this->value - iVar2, (this->range).begin <= iVar3)) {
      lVar4 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      piVar1[lVar4] = iVar3;
    }
    iVar3 = iVar2 * 4;
  } while ((iVar2 < 1) ||
          ((this->range).begin <= this->value + iVar2 * -4 ||
           this->value + iVar3 <= (this->range).end));
  std::vector<int,_std::allocator<int>_>::resize(values,(long)(int)uVar5);
  piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  sort<int,Minisat::LessThan_default<int>>
            (piVar1,(ulong)((long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  __new_size = 1;
  if (1 < (int)uVar5) {
    piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar3 = 0;
    do {
      if (piVar1[__new_size] != piVar1[iVar3]) {
        piVar1[(long)iVar3 + 1] = piVar1[__new_size];
        iVar3 = iVar3 + 1;
      }
      __new_size = __new_size + 1;
    } while (uVar5 != __new_size);
    __new_size = (ulong)(iVar3 + 1);
  }
  std::vector<int,_std::allocator<int>_>::resize(values,__new_size);
  return;
}

Assistant:

void fillGranularityDomain(int granularity, std::vector<int> &values)
    {
        values.resize(granularity);
        int addedValues = 0;
        values[addedValues++] = value;
        int dist = value < 16 ? 1 : (value < 16000 ? 64 : 512); // smarter way to initialize the initial diff value
        if (addedValues < granularity) {
            values[addedValues++] = defaultValue;
        }
        while (addedValues < granularity) {
            if (value + dist > value && value + dist <= range.end) {
                values[addedValues++] = value + dist;
            }
            if (addedValues < granularity && value - dist >= range.begin) {
                values[addedValues++] = value - dist;
            }
            dist = dist * 4;
            if (value - dist < value && value + dist > range.end && value - dist < range.begin) {
                break;
            } // stop if there cannot be more values!
        }
        values.resize(addedValues);
        sort(values);
        int j = 0;
        assert(values[0] >= range.begin && values[0] <= range.end && "stay in bound");
        for (int i = 1; i < addedValues; ++i) {
            if (values[i] != values[j]) {
                assert(values[i] >= range.begin && values[i] <= range.end && "stay in bound");
                values[++j] = values[i];
            }
        }
        j++;
        assert(addedValues > 0 && "there has to be at least one option");
        assert(j <= addedValues && j <= granularity && "collected values hae to stay in bounds");
        values.resize(j);
    }